

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::squash_deleted(dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *this)

{
  size_type min_buckets_wanted;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  tmp;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_90;
  
  if (this->num_deleted != 0) {
    min_buckets_wanted =
         sparsehash_internal::
         sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>::
         min_buckets((sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                      *)this,this->num_elements,this->num_buckets);
    dense_hashtable(&local_90,this,min_buckets_wanted);
    swap(this,&local_90);
    if (local_90.table != (pointer)0x0) {
      free(local_90.table);
    }
  }
  return;
}

Assistant:

void squash_deleted() {          // gets rid of any deleted entries we have
    if (num_deleted) {             // get rid of deleted before writing
      size_type resize_to = settings.min_buckets(
          num_elements, bucket_count());
      dense_hashtable tmp(std::move(*this), resize_to);  // copying will get rid of deleted
      swap(tmp);                   // now we are tmp
    }
    assert(num_deleted == 0);
  }